

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_activation(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  pointer pcVar5;
  long *plVar6;
  string *psVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  Mat local_88;
  string *local_40;
  long local_38;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar11 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    uVar12 = lVar11 >> 3;
    lVar11 = uVar12 + (uVar12 == 0);
    lVar13 = 0;
    local_38 = lVar11;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar13]->type);
      if (iVar8 == 0) {
        uVar14 = lVar13 + 1;
        if (uVar14 < uVar12) {
          iVar8 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar13]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar9 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar14]->type);
            if ((((iVar9 == 0) ||
                 (iVar9 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar14]->
                                              type), iVar9 == 0)) ||
                (iVar9 = std::__cxx11::string::compare
                                   ((char *)&(((this->super_ModelWriter).layers)->
                                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar14]->
                                             type), iVar9 == 0)) &&
               ((pLVar2 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar14],
                piVar10 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                (long)(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar10 == 4 &&
                (lVar11 = local_38, *piVar10 == iVar8)))) goto LAB_001491b7;
            uVar14 = uVar14 + 1;
            lVar11 = local_38;
          } while (uVar14 < uVar12);
        }
        else {
LAB_001491b7:
          if (uVar14 != uVar12) {
            ppLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar2 = ppLVar3[lVar13];
            pLVar4 = ppLVar3[uVar14];
            fprintf(_stderr,"fuse_deconvolutiondepthwise_activation %s %s\n",
                    (pLVar2->name)._M_dataplus._M_p);
            local_40 = &pLVar4->type;
            iVar8 = std::__cxx11::string::compare((char *)local_40);
            psVar7 = local_40;
            if (iVar8 == 0) {
              if ((*(float *)&pLVar4[1]._vptr_Layer != 0.0) ||
                 (NAN(*(float *)&pLVar4[1]._vptr_Layer))) {
                *(undefined4 *)((long)&pLVar2[1].type.field_2 + 8) = 2;
                local_88.cstep = 0;
                local_88.data = (pointer)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,1,4,(Allocator *)0x0);
                piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if ((Mat *)&pLVar2[1].name != &local_88) {
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + 1;
                    UNLOCK();
                  }
                  piVar10 = (int *)pLVar2[1].name._M_string_length;
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      pcVar5 = pLVar2[1].name._M_dataplus._M_p;
                      plVar6 = *(long **)&pLVar2[1].bottoms.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data;
                      if (plVar6 == (long *)0x0) {
                        if (pcVar5 != (pointer)0x0) {
                          free(pcVar5);
                        }
                      }
                      else {
                        (**(code **)(*plVar6 + 0x18))();
                      }
                    }
                  }
                  pLVar2[1].name._M_dataplus._M_p = (pointer)local_88.data;
                  piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar2[1].name._M_string_length = (size_type)piVar10;
                  pLVar2[1].name.field_2._M_allocated_capacity =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)((long)&pLVar2[1].name.field_2 + 8) = local_88.elempack;
                  *(Allocator **)
                   &pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data = local_88.allocator;
                  *(int *)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_88.dims;
                  *(int *)((long)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.w;
                  *(int *)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage = local_88.h;
                  *(int *)((long)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                       local_88.d;
                  *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data = local_88.c;
                  pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)local_88.cstep;
                }
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
                      if ((pointer)local_88.data != (pointer)0x0) {
                        free(local_88.data);
                      }
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                *(undefined4 *)pLVar2[1].name._M_dataplus._M_p =
                     *(undefined4 *)&pLVar4[1]._vptr_Layer;
              }
              else {
                *(undefined4 *)((long)&pLVar2[1].type.field_2 + 8) = 1;
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)local_40);
              if (iVar8 == 0) {
                *(undefined4 *)((long)&pLVar2[1].type.field_2 + 8) = 3;
                local_88.cstep = 0;
                local_88.data = (pointer)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if ((Mat *)&pLVar2[1].name != &local_88) {
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + 1;
                    UNLOCK();
                  }
                  piVar10 = (int *)pLVar2[1].name._M_string_length;
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      pcVar5 = pLVar2[1].name._M_dataplus._M_p;
                      plVar6 = *(long **)&pLVar2[1].bottoms.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data;
                      if (plVar6 == (long *)0x0) {
                        if (pcVar5 != (pointer)0x0) {
                          free(pcVar5);
                        }
                      }
                      else {
                        (**(code **)(*plVar6 + 0x18))();
                      }
                    }
                  }
                  pLVar2[1].name._M_dataplus._M_p = (pointer)local_88.data;
                  piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar2[1].name._M_string_length = (size_type)piVar10;
                  pLVar2[1].name.field_2._M_allocated_capacity =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)((long)&pLVar2[1].name.field_2 + 8) = local_88.elempack;
                  *(Allocator **)
                   &pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data = local_88.allocator;
                  *(int *)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_88.dims;
                  *(int *)((long)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.w;
                  *(int *)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage = local_88.h;
                  *(int *)((long)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                       local_88.d;
                  *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data = local_88.c;
                  pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)local_88.cstep;
                }
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
                      if ((pointer)local_88.data != (pointer)0x0) {
                        free(local_88.data);
                      }
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                pcVar5 = pLVar2[1].name._M_dataplus._M_p;
                *(undefined4 *)pcVar5 = *(undefined4 *)&pLVar4[1]._vptr_Layer;
                *(undefined4 *)(pcVar5 + 4) = *(undefined4 *)((long)&pLVar4[1]._vptr_Layer + 4);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)psVar7);
                if (iVar8 == 0) {
                  *(undefined4 *)((long)&pLVar2[1].type.field_2 + 8) = 4;
                }
              }
            }
            iVar8 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar8;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar8].producer = (int)lVar13;
            std::__cxx11::string::_M_replace
                      ((ulong)local_40,0,(char *)(pLVar4->type)._M_string_length,0x31f19a);
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar11);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - Activation to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_activation %s %s\n", deconvolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                deconvolutiondepthwise->activation_type = 1;
            }
            else
            {
                deconvolutiondepthwise->activation_type = 2;
                deconvolutiondepthwise->activation_params = ncnn::Mat(1);
                deconvolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            deconvolutiondepthwise->activation_type = 3;
            deconvolutiondepthwise->activation_params = ncnn::Mat(2);
            deconvolutiondepthwise->activation_params[0] = clip->min;
            deconvolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            deconvolutiondepthwise->activation_type = 4;
        }

        int top_blob_index_final = activation->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}